

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 make_dict_triphone_list
                (dicthashelement_t **dicthash,hashelement_t ***triphonehash,int ignore_wpos)

{
  dicthashelement_t *pdVar1;
  char *pcVar2;
  phnhashelement_t *ppVar3;
  phnhashelement_t *ppVar4;
  int iVar5;
  hashelement_t **hashtable;
  phnhashelement_t **hashtable_00;
  phnhashelement_t **hashtable_01;
  char *pcVar6;
  char *wp;
  phnhashelement_t **pppVar7;
  hashelement_t *phVar8;
  char *__s1;
  uint uVar9;
  char *wp_00;
  long lVar10;
  char *pcVar11;
  char **ppcVar12;
  dicthashelement_t **ppdVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  uint local_74;
  uint local_70;
  uint local_6c;
  
  hashtable = (hashelement_t **)
              __ckd_calloc__(0x5dc1,0x30,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                             ,0x159);
  hashtable_00 = (phnhashelement_t **)calloc(0x65,0x18);
  hashtable_01 = (phnhashelement_t **)calloc(0x65,0x18);
  if ((hashtable_00 == (phnhashelement_t **)0x0) || (hashtable_01 == (phnhashelement_t **)0x0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x15d,"Unable to alloc %d size phone hashtables!\n",0x65);
    exit(1);
  }
  phninstall("SIL",hashtable_00);
  phninstall("SIL",hashtable_01);
  for (lVar10 = 0; lVar10 != 0x2717; lVar10 = lVar10 + 1) {
    ppdVar13 = dicthash + lVar10;
    while (pdVar1 = *ppdVar13, pdVar1 != (dicthashelement_t *)0x0) {
      ppcVar12 = pdVar1->phones;
      pcVar6 = *ppcVar12;
      if ((*pcVar6 != '+') && (iVar5 = strcmp(pcVar6,"SIL"), iVar5 != 0)) {
        phninstall(pcVar6,hashtable_00);
        ppcVar12 = pdVar1->phones;
      }
      pcVar6 = ppcVar12[(long)pdVar1->nphns + -1];
      if ((*pcVar6 != '+') && (iVar5 = strcmp(pcVar6,"SIL"), iVar5 != 0)) {
        phninstall(pcVar6,hashtable_01);
      }
      ppdVar13 = &pdVar1->next;
    }
  }
  bVar16 = ignore_wpos != 0;
  pcVar6 = "b";
  if (bVar16) {
    pcVar6 = "i";
  }
  wp = "e";
  if (bVar16) {
    wp = "i";
  }
  wp_00 = "s";
  if (bVar16) {
    wp_00 = "i";
  }
  lVar10 = 0;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  uVar9 = 0;
  do {
    if (lVar10 == 0x2717) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1ba,"%d words in dictionary\n");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bb,"%d unique single word triphones in dictionary\n",(ulong)uVar9);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bc,"%d unique word beginning triphones in dictionary\n",(ulong)local_6c);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bd,"%d unique word internal triphones in dictionary\n",(ulong)local_74);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1be,"%d unique word ending triphones in dictionary\n",(ulong)local_70);
      *triphonehash = hashtable;
      freephnhash(hashtable_00);
      freephnhash(hashtable_01);
      return 0;
    }
    ppdVar13 = dicthash + lVar10;
    while (pdVar1 = *ppdVar13, pdVar1 != (dicthashelement_t *)0x0) {
      lVar14 = (long)pdVar1->nphns;
      ppcVar12 = pdVar1->phones;
      pcVar2 = *ppcVar12;
      if (lVar14 == 1) {
        if ((*pcVar2 == '+') || (iVar5 = strcmp(pcVar2,"SIL"), iVar5 == 0)) goto LAB_00103dc1;
        for (lVar14 = 0; lVar14 != 0x65; lVar14 = lVar14 + 1) {
          pppVar7 = hashtable_01 + lVar14;
          while (ppVar3 = *pppVar7, ppVar3 != (phnhashelement_t *)0x0) {
            pcVar11 = ppVar3->phone;
            for (lVar15 = 0; lVar15 != 0x65; lVar15 = lVar15 + 1) {
              pppVar7 = hashtable_00 + lVar15;
              while (ppVar4 = *pppVar7, ppVar4 != (phnhashelement_t *)0x0) {
                phVar8 = install(pcVar2,pcVar11,ppVar4->phone,wp_00,hashtable);
                uVar9 = uVar9 + (phVar8->dictcount == 0);
                phVar8->dictcount = phVar8->dictcount + 1;
                pppVar7 = &ppVar4->next;
              }
            }
            pppVar7 = &ppVar3->next;
          }
        }
LAB_00104096:
        ppdVar13 = &pdVar1->next;
      }
      else if ((*pcVar2 == '+') || (iVar5 = strcmp(pcVar2,"SIL"), iVar5 == 0)) {
LAB_00103dc1:
        ppdVar13 = &pdVar1->next;
      }
      else {
        pcVar11 = ppcVar12[1];
        if ((*pcVar11 == '+') || (iVar5 = strcmp(pcVar11,"SIL"), iVar5 == 0)) {
          pcVar11 = "SIL";
        }
        for (lVar15 = 0; lVar15 != 0x65; lVar15 = lVar15 + 1) {
          pppVar7 = hashtable_01 + lVar15;
          while (ppVar3 = *pppVar7, ppVar3 != (phnhashelement_t *)0x0) {
            phVar8 = install(pcVar2,ppVar3->phone,pcVar11,pcVar6,hashtable);
            local_6c = local_6c + (phVar8->dictcount == 0);
            phVar8->dictcount = phVar8->dictcount + 1;
            pppVar7 = &ppVar3->next;
          }
        }
        for (lVar15 = 1; ppcVar12 = pdVar1->phones, lVar15 < lVar14 + -1; lVar15 = lVar15 + 1) {
          pcVar2 = ppcVar12[lVar15];
          if ((*pcVar2 != '+') && (iVar5 = strcmp(pcVar2,"SIL"), iVar5 != 0)) {
            pcVar11 = ppcVar12[lVar15 + -1];
            if ((*pcVar11 == '+') || (iVar5 = strcmp(pcVar11,"SIL"), iVar5 == 0)) {
              pcVar11 = "SIL";
            }
            __s1 = ppcVar12[lVar15 + 1];
            if ((*__s1 == '+') || (iVar5 = strcmp(__s1,"SIL"), iVar5 == 0)) {
              __s1 = "SIL";
            }
            phVar8 = install(pcVar2,pcVar11,__s1,"i",hashtable);
            local_74 = local_74 + (phVar8->dictcount == 0);
            phVar8->dictcount = phVar8->dictcount + 1;
          }
        }
        pcVar2 = ppcVar12[lVar14 + -1];
        if ((*pcVar2 != '+') && (iVar5 = strcmp(pcVar2,"SIL"), iVar5 != 0)) {
          pcVar11 = ppcVar12[lVar14 + -2];
          if ((*pcVar11 == '+') || (iVar5 = strcmp(pcVar11,"SIL"), iVar5 == 0)) {
            pcVar11 = "SIL";
          }
          for (lVar14 = 0; lVar14 != 0x65; lVar14 = lVar14 + 1) {
            pppVar7 = hashtable_00 + lVar14;
            while (ppVar3 = *pppVar7, ppVar3 != (phnhashelement_t *)0x0) {
              phVar8 = install(pcVar2,pcVar11,ppVar3->phone,wp,hashtable);
              local_70 = local_70 + (phVar8->dictcount == 0);
              phVar8->dictcount = phVar8->dictcount + 1;
              pppVar7 = &ppVar3->next;
            }
          }
          goto LAB_00104096;
        }
        ppdVar13 = &pdVar1->next;
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

int32 make_dict_triphone_list (dicthashelement_t **dicthash,
			  hashelement_t ***triphonehash,
			  int ignore_wpos)
{
    hashelement_t **tphnhash, *tphnptr;
    dicthashelement_t *word_el;
    phnhashelement_t *bphnptr, **bphnhash, *ephnptr, **ephnhash;
    char *bphn, *lctx, *rctx;
    const char* wpos;
    char *silencephn = "SIL";
    int32 totaltphs, totwds, bwdtphs, ewdtphs, iwdtphs, swdtphs, lnphns;
    int32 i,j,k;

    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t));
    bphnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    ephnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    if (bphnhash == NULL || ephnhash == NULL)
	E_FATAL("Unable to alloc %d size phone hashtables!\n",(int)PHNHASHSIZE);

    /*First count all phones that can begin or end a word (SIL can by default)*/
    phninstall(silencephn,bphnhash);
    phninstall(silencephn,ephnhash);
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    if (!IS_FILLER(word_el->phones[0]))
	        phninstall(word_el->phones[0],bphnhash);
	    if (!IS_FILLER(word_el->phones[word_el->nphns - 1]))
	        phninstall(word_el->phones[word_el->nphns - 1],ephnhash);
	    word_el = word_el->next;
        }
    }

    /* Scan dictionary and make triphone list */
    totwds = bwdtphs = ewdtphs = iwdtphs = swdtphs = 0;
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    totwds++;
            lnphns = word_el->nphns;
            if (lnphns == 1) {
                wpos = wordpos2str(WORD_POSN_SINGLE, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
		        for (k = 0; k < PHNHASHSIZE; k++){
		    	    bphnptr = bphnhash[k];
		    	    while (bphnptr != NULL){
				rctx = bphnptr->phone;
                                tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
				if (tphnptr->dictcount == 0) swdtphs++;
				tphnptr->dictcount++;
				bphnptr = bphnptr->next;
			    }
			}
			ephnptr = ephnptr->next;
		    }
		}
            }
            else {
                wpos = wordpos2str(WORD_POSN_BEGIN, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		rctx = word_el->phones[1];
		if (IS_FILLER(rctx)) rctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) bwdtphs++;
			tphnptr->dictcount++;
			ephnptr = ephnptr->next;
		    }
		}
                wpos = wordpos2str(WORD_POSN_INTERNAL, ignore_wpos);
                for (j=1;j<lnphns-1;j++){
                    bphn = word_el->phones[j];
		    if (IS_FILLER(bphn)) continue;
                    lctx = word_el->phones[j-1];
		    if (IS_FILLER(lctx)) lctx = silencephn;
                    rctx = word_el->phones[j+1];
		    if (IS_FILLER(rctx)) rctx = silencephn;
                    tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
		    if (tphnptr->dictcount == 0) iwdtphs++;
		    tphnptr->dictcount++;
                }
                wpos = wordpos2str(WORD_POSN_END, ignore_wpos);
                bphn = word_el->phones[lnphns-1];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		lctx = word_el->phones[lnphns-2];
		if (IS_FILLER(lctx)) lctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    bphnptr = bphnhash[j];
		    while (bphnptr != NULL){
			rctx = bphnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) ewdtphs++;
			tphnptr->dictcount++;
			bphnptr = bphnptr->next;
		    }
		}
            }
	    word_el = word_el->next;
        }
    }
    totaltphs = swdtphs + bwdtphs + iwdtphs + ewdtphs;
    E_INFO("%d words in dictionary\n",totwds);
    E_INFO("%d unique single word triphones in dictionary\n",swdtphs);
    E_INFO("%d unique word beginning triphones in dictionary\n",bwdtphs);
    E_INFO("%d unique word internal triphones in dictionary\n",iwdtphs);
    E_INFO("%d unique word ending triphones in dictionary\n",ewdtphs);

    *triphonehash = tphnhash;

    freephnhash(bphnhash); freephnhash(ephnhash);

    return S3_SUCCESS;
}